

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

bool * __thiscall JSON::JSONValue::getBoolValue(JSONValue *this)

{
  JSONValueType JVar1;
  ostream *poVar2;
  bool local_3d [13];
  string local_30;
  JSONValue *local_10;
  JSONValue *this_local;
  
  local_10 = this;
  JVar1 = getType(this);
  if (JVar1 != BOOLEAN) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error requesting JSON bool value from ");
    getTypeAsString_abi_cxx11_(&local_30,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_30);
    poVar2 = std::operator<<(poVar2," (");
    JVar1 = getType(this);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,JVar1);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_30);
    local_3d[0] = false;
    setBoolValue(this,local_3d);
  }
  return (bool *)this->data;
}

Assistant:

bool &JSONValue::getBoolValue() {
	if(getType()!=BOOLEAN)
	{
		#ifdef JSON_TYPE_ERRORS_ON
		cerr << "Error requesting JSON bool value from " << getTypeAsString() << " (" << getType() << ")" << endl;
		#endif
		setBoolValue(false);
	}
	return *((bool*)data);
}